

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Abc_ExactNormalizeArrivalTimesForNetwork(int nVars,int *pArrTimeProfile,char *pSol)

{
  size_t __size;
  char cVar1;
  char cVar2;
  char cVar3;
  Vec_Int_t *p;
  long lVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint i;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int nMax;
  int local_34;
  
  cVar1 = pSol[2];
  uVar7 = (uint)cVar1;
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = nVars;
  p->nCap = nVars;
  lVar4 = (long)nVars;
  __size = lVar4 * 4;
  piVar5 = (int *)malloc(__size);
  p->pArray = piVar5;
  memcpy(piVar5,pArrTimeProfile,__size);
  if (0 < (int)uVar7) {
    uVar12 = 0;
    do {
      cVar2 = pSol[uVar12 * 4 + 5];
      if ((((cVar2 < '\0') || (p->nSize <= (int)cVar2)) ||
          (cVar3 = pSol[uVar12 * 4 + 6], cVar3 < '\0')) || (p->nSize <= (int)cVar3))
      goto LAB_002af5d2;
      iVar10 = p->pArray[(uint)(int)cVar2];
      iVar6 = p->pArray[(uint)(int)cVar3];
      if (iVar6 < iVar10) {
        iVar6 = iVar10;
      }
      Vec_IntPush(p,iVar6 + 1);
      uVar12 = uVar12 + 1;
    } while (uVar7 != uVar12);
  }
  iVar10 = uVar7 + nVars;
  if (1 < iVar10) {
    uVar8 = iVar10 - 1;
    uVar9 = 1;
    if (1 < (int)uVar8) {
      uVar9 = uVar8;
    }
    i = 0;
    do {
      if (p->nSize < iVar10) goto LAB_002af5d2;
      Vec_IntSetEntry(p,i,p->pArray[uVar8]);
      i = i + 1;
    } while (uVar9 != i);
  }
  if ('\0' < cVar1) {
    lVar13 = (long)(int)uVar7 + 1;
    do {
      uVar7 = (uint)pSol[lVar13 * 4 + -3];
      if (((pSol[lVar13 * 4 + -3] < '\0') || (p->nSize <= (int)uVar7)) ||
         ((lVar11 = lVar4 + lVar13 + -2, lVar11 < 0 || (p->nSize <= lVar11)))) {
LAB_002af5d2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      cVar1 = pSol[lVar13 * 4 + -2];
      uVar8 = (uint)cVar1;
      iVar10 = p->pArray[uVar7];
      iVar6 = p->pArray[lVar4 + lVar13 + -2] + -1;
      if (iVar10 < iVar6) {
        iVar6 = iVar10;
      }
      Vec_IntSetEntry(p,uVar7,iVar6);
      if (((cVar1 < '\0') || (p->nSize <= (int)uVar8)) || (p->nSize <= lVar11)) goto LAB_002af5d2;
      iVar10 = p->pArray[uVar8];
      iVar6 = p->pArray[lVar4 + lVar13 + -2] + -1;
      if (iVar10 < iVar6) {
        iVar6 = iVar10;
      }
      Vec_IntSetEntry(p,uVar8,iVar6);
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  piVar5 = p->pArray;
  Abc_NormalizeArrivalTimes(piVar5,nVars,&local_34);
  memcpy(pArrTimeProfile,piVar5,__size);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

static void Abc_ExactNormalizeArrivalTimesForNetwork( int nVars, int * pArrTimeProfile, char * pSol )
{
    int nGates, i, j, k, nMax;
    Vec_Int_t * vLevels;

    nGates = pSol[ABC_EXACT_SOL_NGATES];

    /* printf( "NORMALIZE\n" ); */
    /* printf( "  #vars  = %d\n", nVars ); */
    /* printf( "  #gates = %d\n", nGates ); */

    vLevels = Vec_IntAllocArrayCopy( pArrTimeProfile, nVars );

    /* compute level of each gate based on arrival time profile (to compute depth) */
    for ( i = 0; i < nGates; ++i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntPush( vLevels, Abc_MaxInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, k ) ) + 1 );

        /* printf( "  gate %d = (%d,%d)\n", nVars + i, j, k ); */
    }

    /* Vec_IntPrint( vLevels ); */

    /* reset all levels except for the last one */
    for ( i = 0; i < nVars + nGates - 1; ++i )
        Vec_IntSetEntry( vLevels, i, Vec_IntEntry( vLevels, nVars + nGates - 1 ) );

    /* Vec_IntPrint( vLevels ); */

    /* compute levels from top to bottom */
    for ( i = nGates - 1; i >= 0; --i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntSetEntry( vLevels, j, Abc_MinInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
        Vec_IntSetEntry( vLevels, k, Abc_MinInt( Vec_IntEntry( vLevels, k ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
    }

    /* Vec_IntPrint( vLevels ); */

    /* normalize arrival times */
    Abc_NormalizeArrivalTimes( Vec_IntArray( vLevels ), nVars, &nMax );
    memcpy( pArrTimeProfile, Vec_IntArray( vLevels ), sizeof(int) * nVars );

    /* printf( "  nMax = %d\n", nMax ); */
    /* Vec_IntPrint( vLevels ); */

    Vec_IntFree( vLevels );
}